

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void attract_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  ulong uVar1;
  bool bVar2;
  long in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  if ((1 < in_RDI->in_room->area->sky) &&
     (uVar1 = in_RDI->in_room->room_flags[0], _Var3 = std::pow<int,int>(0,0x6e1451),
     (uVar1 & (long)_Var3) == 0)) {
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    if (*(long *)(in_RSI + 8) == 0) {
      *(CHAR_DATA **)(in_RSI + 8) = in_RDI;
    }
    dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
               in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368,
               in_stack_00001370,in_stack_00001378);
    bVar2 = is_awake(in_RDI);
    if (!bVar2) {
      in_RDI->position = 8;
    }
  }
  return;
}

Assistant:

void attract_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if (ch->in_room->area->sky < WeatherCondition::Overcast || IS_SET(ch->in_room->room_flags, ROOM_INDOORS))
		return;

	act("Your skin tingles briefly, and a bolt arcs down from the dark skies above!", ch, nullptr, ch, TO_CHAR);
	act("The skies light up as lightning arcs like quicksilver towards $N!", ch, nullptr, ch, TO_ROOM);

	if (!af->owner)
		af->owner = ch;

	damage_new(af->owner, ch, dice(af->level, 4), gsn_attract, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the lightning strike*");

	if (!is_awake(ch))
		ch->position = POS_STANDING;
}